

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::ContentEncoding::ParseEncryptionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncryption *encryption)

{
  uchar **ppuVar1;
  uchar **ppuVar2;
  uchar **ppuVar3;
  int iVar4;
  long lVar5;
  uchar *puVar6;
  unsigned_long_long uVar7;
  ulong uVar8;
  ContentEncoding *this_00;
  long lVar9;
  long stop;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_70;
  ulong local_68;
  ContentEncryption *local_60;
  uchar **local_58;
  uchar **local_50;
  uchar **local_48;
  ContentEncAESSettings *local_40;
  longlong local_38;
  
  stop = size + start;
  local_40 = &encryption->aes_settings;
  local_48 = &encryption->sig_key_id;
  local_50 = &encryption->signature;
  local_58 = &encryption->key_id;
  local_70 = start;
  local_60 = encryption;
  do {
    if (stop <= local_70) {
      return 0;
    }
    this_00 = (ContentEncoding *)pReader;
    lVar5 = ParseElementHeader(pReader,&local_70,stop,&local_38,(longlong *)&local_68);
    ppuVar3 = local_48;
    ppuVar2 = local_50;
    ppuVar1 = local_58;
    uVar8 = local_68;
    lVar9 = local_70;
    if (lVar5 < 0) {
      return lVar5;
    }
    switch(local_38) {
    case 0x47e1:
      uVar7 = UnserializeUInt(pReader,local_70,local_68);
      encryption->algo = uVar7;
      if (uVar7 != 5) {
        return -2;
      }
      break;
    case 0x47e2:
      if (*local_58 != (uchar *)0x0) {
        operator_delete__(*local_58);
      }
      uVar8 = local_68;
      *ppuVar1 = (uchar *)0x0;
      ppuVar1[1] = (uchar *)0x0;
      if ((long)local_68 < 1) {
        return -2;
      }
      if (0x80000000 < local_68) {
        return -1;
      }
      puVar6 = (uchar *)operator_new__(local_68,(nothrow_t *)&std::nothrow);
      lVar9 = local_70;
      if (puVar6 == (uchar *)0x0) {
        return -1;
      }
      iVar4 = (**pReader->_vptr_IMkvReader)(pReader,local_70,uVar8,puVar6);
      if (iVar4 != 0) {
LAB_0016066e:
        operator_delete__(puVar6);
        return 0;
      }
      local_60->key_id = puVar6;
      local_60->key_id_len = uVar8;
      encryption = local_60;
      break;
    case 0x47e3:
      if (*local_50 != (uchar *)0x0) {
        operator_delete__(*local_50);
      }
      uVar8 = local_68;
      *ppuVar2 = (uchar *)0x0;
      ppuVar2[1] = (uchar *)0x0;
      if ((long)local_68 < 1) {
        return -2;
      }
      if (0x80000000 < local_68) {
        return -1;
      }
      puVar6 = (uchar *)operator_new__(local_68,(nothrow_t *)&std::nothrow);
      lVar9 = local_70;
      if (puVar6 == (uchar *)0x0) {
        return -1;
      }
      iVar4 = (**pReader->_vptr_IMkvReader)(pReader,local_70,uVar8,puVar6);
      if (iVar4 != 0) goto LAB_0016066e;
      local_60->signature = puVar6;
      local_60->signature_len = uVar8;
      encryption = local_60;
      break;
    case 0x47e4:
      if (*local_48 != (uchar *)0x0) {
        operator_delete__(*local_48);
      }
      uVar8 = local_68;
      *ppuVar3 = (uchar *)0x0;
      ppuVar3[1] = (uchar *)0x0;
      if ((long)local_68 < 1) {
        return -2;
      }
      if (0x80000000 < local_68) {
        return -1;
      }
      puVar6 = (uchar *)operator_new__(local_68,(nothrow_t *)&std::nothrow);
      lVar9 = local_70;
      if (puVar6 == (uchar *)0x0) {
        return -1;
      }
      iVar4 = (**pReader->_vptr_IMkvReader)(pReader,local_70,uVar8,puVar6);
      if (iVar4 != 0) goto LAB_0016066e;
      local_60->sig_key_id = puVar6;
      local_60->sig_key_id_len = uVar8;
      encryption = local_60;
      break;
    case 0x47e5:
      uVar7 = UnserializeUInt(pReader,local_70,local_68);
      encryption->sig_algo = uVar7;
      break;
    case 0x47e6:
      uVar7 = UnserializeUInt(pReader,local_70,local_68);
      encryption->sig_hash_algo = uVar7;
      break;
    case 0x47e7:
      lVar5 = ParseContentEncAESSettingsEntry(this_00,local_70,local_68,pReader,local_40);
      if (lVar5 != 0) {
        return lVar5;
      }
    }
    local_70 = lVar9 + uVar8;
    if (stop < local_70) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseEncryptionEntry(long long start, long long size,
                                           IMkvReader* pReader,
                                           ContentEncryption* encryption) {
  assert(pReader);
  assert(encryption);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncAlgo) {
      encryption->algo = UnserializeUInt(pReader, pos, size);
      if (encryption->algo != 5)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvContentEncKeyID) {
      delete[] encryption->key_id;
      encryption->key_id = NULL;
      encryption->key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->key_id = buf;
      encryption->key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSignature) {
      delete[] encryption->signature;
      encryption->signature = NULL;
      encryption->signature_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->signature = buf;
      encryption->signature_len = buflen;
    } else if (id == libwebm::kMkvContentSigKeyID) {
      delete[] encryption->sig_key_id;
      encryption->sig_key_id = NULL;
      encryption->sig_key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->sig_key_id = buf;
      encryption->sig_key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSigAlgo) {
      encryption->sig_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentSigHashAlgo) {
      encryption->sig_hash_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncAESSettings) {
      const long status = ParseContentEncAESSettingsEntry(
          pos, size, pReader, &encryption->aes_settings);
      if (status)
        return status;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}